

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O1

void __thiscall
QPDFCrypto_openssl::rijndael_init
          (QPDFCrypto_openssl *this,bool encrypt,uchar *key_data,size_t key_len,bool cbc_mode,
          uchar *cbc_block)

{
  int iVar1;
  EVP_CIPHER *cipher;
  
  if (key_len == 0x18) {
    if (cbc_mode) {
      cipher = EVP_aes_192_cbc();
    }
    else {
      cipher = EVP_aes_192_ecb();
    }
  }
  else if (key_len == 0x20) {
    if (cbc_mode) {
      cipher = EVP_aes_256_cbc();
    }
    else {
      cipher = EVP_aes_256_ecb();
    }
  }
  else if (cbc_mode) {
    cipher = EVP_aes_128_cbc();
  }
  else {
    cipher = EVP_aes_128_ecb();
  }
  iVar1 = EVP_CIPHER_CTX_reset(this->cipher_ctx);
  check_openssl(iVar1);
  iVar1 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)this->cipher_ctx,cipher,(ENGINE *)0x0,key_data,
                            cbc_block,(uint)encrypt);
  check_openssl(iVar1);
  iVar1 = EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)this->cipher_ctx,0);
  check_openssl(iVar1);
  return;
}

Assistant:

void
QPDFCrypto_openssl::rijndael_init(
    bool encrypt,
    unsigned char const* key_data,
    size_t key_len,
    bool cbc_mode,
    unsigned char* cbc_block)
{
    const EVP_CIPHER* cipher = nullptr;
    switch (key_len) {
    case 32:
        cipher = cbc_mode ? EVP_aes_256_cbc() : EVP_aes_256_ecb();
        break;
    case 24:
        cipher = cbc_mode ? EVP_aes_192_cbc() : EVP_aes_192_ecb();
        break;
    default:
        cipher = cbc_mode ? EVP_aes_128_cbc() : EVP_aes_128_ecb();
        break;
    }

    check_openssl(EVP_CIPHER_CTX_reset(cipher_ctx));
    check_openssl(
        // line-break
        EVP_CipherInit_ex(cipher_ctx, cipher, nullptr, key_data, cbc_block, encrypt));
    check_openssl(EVP_CIPHER_CTX_set_padding(cipher_ctx, 0));
}